

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  ushort *puVar3;
  int iVar4;
  long extraout_RDX;
  ptls_buffer_t *__dest;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  pcVar1 = (char *)((long)bignum + size);
  if (0 < (long)size) {
    for (; *bignum == '\0'; bignum = (void *)((long)bignum + 1)) {
      size = size - 1;
      if ((long)size < 1) {
        size = 0;
        bignum = pcVar1;
        break;
      }
    }
  }
  iVar4 = ptls_buffer_reserve(buf,1);
  if (iVar4 == 0) {
    buf->base[buf->off] = '\x02';
    buf->off = buf->off + 1;
    iVar4 = ptls_buffer_reserve(buf,1);
    if (iVar4 == 0) {
      buf->base[buf->off] = 0xff;
      sVar2 = buf->off;
      sVar5 = sVar2 + 1;
      buf->off = sVar5;
      if (*bignum < '\0') {
        iVar4 = ptls_buffer_reserve(buf,1);
        if (iVar4 != 0) {
          return iVar4;
        }
        buf->base[buf->off] = '\0';
        buf->off = buf->off + 1;
      }
      if ((char *)bignum == pcVar1) {
        size = 1;
        bignum = (char *)0x1;
        __dest = buf;
        iVar4 = ptls_buffer_reserve(buf,1);
        if (iVar4 != 0) {
          return iVar4;
        }
        buf->base[buf->off] = '\0';
      }
      else {
        iVar4 = ptls_buffer_reserve(buf,size);
        if (iVar4 != 0) {
          return iVar4;
        }
        __dest = (ptls_buffer_t *)(buf->base + buf->off);
        memcpy(__dest,bignum,size);
      }
      sVar6 = size + buf->off;
      buf->off = sVar6;
      uVar7 = sVar6 - sVar5;
      if (0x7f < uVar7) {
        ptls_buffer_push_asn1_ubigint_cold_1();
        puVar3 = *bignum;
        iVar4 = 0x32;
        if (1 < extraout_RDX - (long)puVar3) {
          *(ushort *)&__dest->base = *puVar3 << 8 | *puVar3 >> 8;
          *(ushort **)bignum = puVar3 + 1;
          iVar4 = 0;
        }
        return iVar4;
      }
      buf->base[sVar2] = (uint8_t)uVar7;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *const end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}